

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O0

Abc_Obj_t * Abc_NodeSuperChoiceLut(Abc_ManScl_t *p,Abc_Obj_t *pObj)

{
  Mem_Flex_t *pMan;
  int iVar1;
  uint uWord;
  int nVars_00;
  Abc_Obj_t *pAVar2;
  uint *puVar3;
  void *pvVar4;
  Abc_Obj_t *pFanin_00;
  char *pcVar5;
  int nSuppVars;
  int uSupport;
  int nVars;
  int i;
  Abc_Obj_t *pObjNew;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj_local;
  Abc_ManScl_t *p_local;
  
  Abc_NodeSuperChoiceCollect2(pObj,p->vLeaves,p->vVolume);
  pAVar2 = (Abc_Obj_t *)Vec_PtrEntryLast(p->vVolume);
  if (pAVar2 != pObj) {
    __assert_fail("Vec_PtrEntryLast(p->vVolume) == pObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                  ,0x21b,"Abc_Obj_t *Abc_NodeSuperChoiceLut(Abc_ManScl_t *, Abc_Obj_t *)");
  }
  puVar3 = Abc_NodeSuperChoiceTruth(p);
  p->uTruth = puVar3;
  iVar1 = Vec_PtrSize(p->vLeaves);
  uWord = Extra_TruthSupport(p->uTruth,iVar1);
  nVars_00 = Extra_WordCountOnes(uWord);
  if (iVar1 < nVars_00) {
    __assert_fail("nSuppVars <= nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                  ,0x222,"Abc_Obj_t *Abc_NodeSuperChoiceLut(Abc_ManScl_t *, Abc_Obj_t *)");
  }
  if (nVars_00 == 0) {
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfff;
  }
  else if (nVars_00 == 1) {
    uSupport = 0;
    while ((uSupport < iVar1 && ((uWord & 1 << ((byte)uSupport & 0x1f)) == 0))) {
      uSupport = uSupport + 1;
    }
    if (iVar1 <= uSupport) {
      __assert_fail("i < nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                    ,0x22e,"Abc_Obj_t *Abc_NodeSuperChoiceLut(Abc_ManScl_t *, Abc_Obj_t *)");
    }
    pvVar4 = Vec_PtrEntry(p->vLeaves,uSupport);
    *(uint *)&pObj->field_0x14 =
         *(uint *)&pObj->field_0x14 & 0xfff | *(uint *)((long)pvVar4 + 0x14) & 0xfffff000;
  }
  else {
    if (nVars_00 != iVar1) {
      Extra_TruthShrink(*p->uCofs,p->uTruth,nVars_00,iVar1,uWord);
      Extra_TruthCopy(p->uTruth,*p->uCofs,iVar1);
      Abc_NodeLeavesRemove(p->vLeaves,(1 << ((byte)iVar1 & 0x1f)) - 1U & (uWord ^ 0xffffffff),iVar1)
      ;
    }
    do {
      iVar1 = Vec_PtrSize(p->vLeaves);
      if (iVar1 <= p->nLutSize) {
        pAVar2 = Abc_NtkCreateNode(pObj->pNtk);
        for (uSupport = 0; iVar1 = Vec_PtrSize(p->vLeaves), uSupport < iVar1;
            uSupport = uSupport + 1) {
          pFanin_00 = (Abc_Obj_t *)Vec_PtrEntry(p->vLeaves,uSupport);
          Abc_ObjAddFanin(pAVar2,pFanin_00);
        }
        pMan = (Mem_Flex_t *)pObj->pNtk->pManFunc;
        iVar1 = Vec_PtrSize(p->vLeaves);
        pcVar5 = Abc_SopCreateFromTruth(pMan,iVar1,p->uTruth);
        (pAVar2->field_5).pData = pcVar5;
        iVar1 = Abc_NodeGetLevel(pAVar2);
        *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xfff | iVar1 << 0xc;
        return pAVar2;
      }
      iVar1 = Abc_NodeDecomposeStep(p);
    } while (iVar1 != 0);
    for (uSupport = 0; iVar1 = Vec_PtrSize(p->vLeaves), uSupport < iVar1; uSupport = uSupport + 1) {
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p->vLeaves,uSupport);
      iVar1 = Abc_ObjIsNode(pAVar2);
      if ((iVar1 != 0) && (iVar1 = Abc_ObjFanoutNum(pAVar2), iVar1 == 0)) {
        Abc_NtkDeleteObj_rec(pAVar2,1);
      }
    }
  }
  return (Abc_Obj_t *)0x0;
}

Assistant:

Abc_Obj_t * Abc_NodeSuperChoiceLut( Abc_ManScl_t * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin, * pObjNew;
    int i, nVars, uSupport, nSuppVars;
    // collect the cone using DFS (excluding leaves)
    Abc_NodeSuperChoiceCollect2( pObj, p->vLeaves, p->vVolume );
    assert( Vec_PtrEntryLast(p->vVolume) == pObj );  
    // compute the truth table
    p->uTruth = Abc_NodeSuperChoiceTruth( p );
    // get the support of this truth table
    nVars = Vec_PtrSize(p->vLeaves);
    uSupport = Extra_TruthSupport(p->uTruth, nVars);
    nSuppVars = Extra_WordCountOnes(uSupport);
    assert( nSuppVars <= nVars );
    if ( nSuppVars == 0 )
    {
        pObj->Level = 0;
        return NULL;
    }
    if ( nSuppVars == 1 )
    {
        // find the variable
        for ( i = 0; i < nVars; i++ )
            if ( uSupport & (1 << i) )
                break;
        assert( i < nVars );
        pFanin = (Abc_Obj_t *)Vec_PtrEntry( p->vLeaves, i );
        pObj->Level = pFanin->Level;
        return NULL;
    }
    // support-minimize the truth table
    if ( nSuppVars != nVars )
    {
        Extra_TruthShrink( p->uCofs[0], p->uTruth, nSuppVars, nVars, uSupport );
        Extra_TruthCopy( p->uTruth, p->uCofs[0], nVars );
        Abc_NodeLeavesRemove( p->vLeaves, ((1 << nVars) - 1) & ~uSupport, nVars );
    }
//    return NULL;
    // decompose the truth table recursively
    while ( Vec_PtrSize(p->vLeaves) > p->nLutSize )
        if ( !Abc_NodeDecomposeStep( p ) )
        {
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pFanin, i )
                if ( Abc_ObjIsNode(pFanin) && Abc_ObjFanoutNum(pFanin) == 0 )
                    Abc_NtkDeleteObj_rec( pFanin, 1 );
            return NULL;
        }
    // create the topmost node
    pObjNew = Abc_NtkCreateNode( pObj->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pFanin, i )
        Abc_ObjAddFanin( pObjNew, pFanin );
    // create the function
    pObjNew->pData = Abc_SopCreateFromTruth( (Mem_Flex_t *)pObj->pNtk->pManFunc, Vec_PtrSize(p->vLeaves), p->uTruth ); // need ISOP
    pObjNew->Level = Abc_NodeGetLevel( pObjNew );
    return pObjNew;
}